

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::LoadBean::
act<hiberlite::AVisitor<hiberlite::LoadBean>,std::__cxx11::string,hiberlite::stl_stream_adapter<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (LoadBean *this,AVisitor<hiberlite::LoadBean> *av,
          collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *nvp)

{
  int *piVar1;
  undefined ***pppuVar2;
  pointer pcVar3;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar5;
  _Elt_pointer ppVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_value;
  long *plVar7;
  undefined8 *puVar8;
  runtime_error *this_01;
  long *plVar9;
  _func_int ***ppp_Var10;
  ulong uVar11;
  _func_int **pp_Var12;
  undefined8 uVar13;
  string query;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> el;
  SQLiteSelect sel;
  vector<long_long,_std::allocator<long_long>_> children;
  string tab;
  long *local_290;
  long local_280;
  long lStack_278;
  undefined1 local_270 [8];
  size_type local_268;
  undefined **local_260 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  _Alloc_hider local_248;
  undefined1 local_240 [24];
  shared_connection local_228;
  undefined1 local_218 [16];
  _func_int **local_208;
  shared_cnt_obj_pair<hiberlite::statement_ptr> *psStack_200;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *local_1f0;
  shared_connection local_1e8;
  vector<long_long,_std::allocator<long_long>_> local_1d8;
  string local_1c0;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  string local_138;
  string local_118;
  string local_f8;
  undefined1 local_d8 [40];
  _Alloc_hider local_b0;
  char local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pcVar3 = (nvp->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (nvp->name)._M_string_length);
  AVisitor<hiberlite::LoadBean>::diveTable(av,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_270 = (undefined1  [8])local_260;
  pcVar3 = (av->scope)._table._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,pcVar3,pcVar3 + (av->scope)._table._M_string_length);
  pcVar3 = (av->scope)._prefix._M_dataplus._M_p;
  local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar3,pcVar3 + (av->scope)._prefix._M_string_length);
  local_240._16_4_ = (av->scope).prefix_depth;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_270,(pointer)((long)local_270 + local_268));
  if (local_250 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240) {
    operator_delete(local_250);
  }
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  local_1e8._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  local_1e8.res = (av->rootKey).con.res;
  if (local_1e8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1e8.res)->refCount = (local_1e8.res)->refCount + 1;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_160._M_dataplus._M_p,
             local_160._M_dataplus._M_p + local_160._M_string_length);
  ppVar6 = (this->stmt).c.
           super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar6 == (this->stmt).c.
                super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppVar6 = (this->stmt).c.
             super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
  }
  Database::dbSelectChildIds(&local_1d8,&local_1e8,&local_70,ppVar6[-1].second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_1e8._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_1e8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_1e8.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_1e8.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((nvp->stream).ct);
  (nvp->stream).it._M_current =
       (((nvp->stream).ct)->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  if (local_1d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_1d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar11 = 0;
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&PTR__SQLiteSelect_00199a70;
    do {
      _value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
      (_value->_M_dataplus)._M_p = (pointer)&_value->field_2;
      _value->_M_string_length = 0;
      (_value->field_2)._M_local_buf[0] = '\0';
      std::operator+(&local_90,"SELECT * FROM ",&local_160);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_1a0 = &local_190;
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_190 = *plVar9;
        lStack_188 = plVar7[3];
      }
      else {
        local_190 = *plVar9;
        local_1a0 = (long *)*plVar7;
      }
      local_198 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
      local_180 = &local_170;
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_170 = *plVar9;
        lStack_168 = plVar7[3];
      }
      else {
        local_170 = *plVar9;
        local_180 = (long *)*plVar7;
      }
      local_178 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
      local_218._0_8_ = &local_208;
      ppp_Var10 = (_func_int ***)(plVar7 + 2);
      if ((_func_int ***)*plVar7 == ppp_Var10) {
        local_208 = *ppp_Var10;
        psStack_200 = (shared_cnt_obj_pair<hiberlite::statement_ptr> *)plVar7[3];
      }
      else {
        local_208 = *ppp_Var10;
        local_218._0_8_ = (_func_int ***)*plVar7;
      }
      local_218._8_8_ = plVar7[1];
      *plVar7 = (long)ppp_Var10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      Transformer::toSQLiteValue_abi_cxx11_
                (&local_1c0,
                 (Transformer *)
                 (local_1d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar11),(longlong *)local_218._8_8_);
      pp_Var12 = (_func_int **)0xf;
      if ((_func_int ***)local_218._0_8_ != &local_208) {
        pp_Var12 = local_208;
      }
      if (pp_Var12 < (_func_int **)(local_1c0._M_string_length + local_218._8_8_)) {
        uVar13 = (_func_int **)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          uVar13 = local_1c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < (_func_int **)(local_1c0._M_string_length + local_218._8_8_))
        goto LAB_00113f4f;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,local_218._0_8_);
      }
      else {
LAB_00113f4f:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append(local_218,(ulong)local_1c0._M_dataplus._M_p);
      }
      local_270 = (undefined1  [8])local_260;
      pppuVar2 = (undefined ***)(puVar8 + 2);
      if ((undefined ***)*puVar8 == pppuVar2) {
        local_260[0] = *pppuVar2;
        local_260[1] = (undefined **)puVar8[3];
      }
      else {
        local_260[0] = *pppuVar2;
        local_270 = (undefined1  [8])*puVar8;
      }
      local_268 = puVar8[1];
      *puVar8 = pppuVar2;
      puVar8[1] = 0;
      *(undefined1 *)pppuVar2 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)local_270);
      local_290 = &local_280;
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_280 = *plVar9;
        lStack_278 = plVar7[3];
      }
      else {
        local_280 = *plVar9;
        local_290 = (long *)*plVar7;
      }
      lVar4 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_270 != (undefined1  [8])local_260) {
        operator_delete((void *)local_270);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((_func_int ***)local_218._0_8_ != &local_208) {
        operator_delete((void *)local_218._0_8_);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      local_228._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
      local_228.res = (av->rootKey).con.res;
      if (local_228.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        (local_228.res)->refCount = (local_228.res)->refCount + 1;
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_290,lVar4 + (long)local_290);
      SQLiteSelect::SQLiteSelect((SQLiteSelect *)local_218,&local_228,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      local_228._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
      if (local_228.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &(local_228.res)->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_228.res)->_vptr_shared_cnt_obj_pair[1])();
        }
      }
      bVar5 = SQLiteSelect::step((SQLiteSelect *)local_218);
      if (!bVar5) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"id not found in the database");
        *(undefined ***)this_01 = &PTR__runtime_error_001998c8;
        __cxa_throw(this_01,&database_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_270 = (undefined1  [8])local_140;
      local_268 = CONCAT71(local_268._1_7_,local_218[8]);
      local_260[0] = &PTR__shared_res_001998f0;
      local_260[1] = (undefined **)psStack_200;
      if (psStack_200 != (shared_cnt_obj_pair<hiberlite::statement_ptr> *)0x0) {
        psStack_200->refCount = psStack_200->refCount + 1;
      }
      local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &PTR__shared_res_001997b8;
      local_248._M_p = (pointer)local_1f0;
      if (local_1f0 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        local_1f0->refCount = local_1f0->refCount + 1;
      }
      local_240._0_8_ =
           local_1d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11];
      std::
      deque<std::pair<hiberlite::SQLiteSelect,long_long>,std::allocator<std::pair<hiberlite::SQLiteSelect,long_long>>>
      ::emplace_back<std::pair<hiberlite::SQLiteSelect,long_long>>
                ((deque<std::pair<hiberlite::SQLiteSelect,long_long>,std::allocator<std::pair<hiberlite::SQLiteSelect,long_long>>>
                  *)this,(pair<hiberlite::SQLiteSelect,_long_long> *)local_270);
      SQLiteSelect::~SQLiteSelect((SQLiteSelect *)local_270);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"item","");
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
      sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      sql_nvp((sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_270,&local_138,_value,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d8,local_270,(pointer)((long)local_270 + local_268));
      local_d8._32_8_ = local_250;
      local_b0._M_p = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_248._M_p,local_248._M_p + local_240._0_8_);
      AVisitor<hiberlite::LoadBean>::operator&
                (av,(sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_d8);
      if (local_b0._M_p != local_a0) {
        operator_delete(local_b0._M_p);
      }
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_);
      }
      std::
      deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
      ::pop_back((deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
                  *)this);
      this_00 = (nvp->stream).ct;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(this_00,(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,_value);
      (nvp->stream).it._M_current =
           (((nvp->stream).ct)->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      access::destroy<hiberlite::LoadBean,std::__cxx11::string>(this,_value);
      if (local_248._M_p != local_240 + 8) {
        operator_delete(local_248._M_p);
      }
      if (local_270 != (undefined1  [8])local_260) {
        operator_delete((void *)local_270);
      }
      SQLiteSelect::~SQLiteSelect((SQLiteSelect *)local_218);
      if (local_290 != &local_280) {
        operator_delete(local_290);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)local_1d8.
                                    super__Vector_base<long_long,_std::allocator<long_long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1d8.
                                    super__Vector_base<long_long,_std::allocator<long_long>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  AVisitor<hiberlite::LoadBean>::popScope(av);
  if (local_1d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LoadBean::act(AV& av, collection_nvp<E,S> nvp )
{
	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		std::vector<sqlid_t> children=Database::dbSelectChildIds(av.getConnection(), tab, stmt.top().second);
		nvp.stream.startLoadFromDb();

		for(size_t i=0;i<children.size();i++){
			E* entry;
			construct(av,&entry,static_cast<unsigned int>(0));

				std::string query="SELECT * FROM "+tab
								+" WHERE "+HIBERLITE_PRIMARY_KEY_COLUMN+"="+Transformer::toSQLiteValue(children[i])+";";
				SQLiteSelect sel(av.getConnection(), query);
				if(!sel.step())
					throw database_error("id not found in the database");
				stmt.push( std::make_pair(sel,children[i]) );

					sql_nvp<E> el("item", *entry);
					av & el;

				stmt.pop();
			nvp.stream.putNext(*entry);
			destroy(*this, entry, static_cast<unsigned int>(0));
		}
	av.pop();
}